

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O3

bool deqp::gles31::Functional::anon_unknown_2::verifyImageWithVerifier
               (Surface *resultImage,TestLog *log,Verifier *verifier,bool logOnSuccess)

{
  ostringstream *this;
  TextureFormat TVar1;
  TextureFormat TVar2;
  int iVar3;
  int iVar4;
  TestLog *pTVar5;
  ConstPixelBufferAccess *pCVar6;
  LogImageSet *access;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *pvVar7;
  bool bVar8;
  ChannelOrder CVar9;
  ChannelType CVar10;
  Surface errorMask;
  RGBA color;
  string local_450;
  string local_430;
  Surface local_410;
  string local_3f8;
  string local_3d8;
  TextureFormat local_3b8;
  TextureFormat local_3b0;
  undefined1 local_3a8 [40];
  undefined1 local_380 [40];
  string local_358;
  string local_338;
  LogImageSet local_318;
  LogImage local_2d8;
  LogImage local_240;
  undefined1 local_1b0 [384];
  
  tcu::Surface::Surface(&local_410,resultImage->m_width,resultImage->m_height);
  local_2d8.m_name._M_dataplus._M_p = (pointer)0x300000008;
  pvVar7 = (void *)local_410.m_pixels.m_cap;
  if ((void *)local_410.m_pixels.m_cap != (void *)0x0) {
    pvVar7 = local_410.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,(TextureFormat *)&local_2d8,local_410.m_width,
             local_410.m_height,1,pvVar7);
  local_2d8.m_name._M_dataplus._M_p = (pointer)0x3f80000000000000;
  local_2d8.m_name._M_string_length = 0x3f80000000000000;
  tcu::clear((PixelBufferAccess *)local_1b0,(Vec4 *)&local_2d8);
  if (logOnSuccess) {
    this = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(this);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"Verifying image.",0x10);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
    (*verifier->_vptr_Verifier[1])(verifier,log);
  }
  iVar4 = resultImage->m_height;
  if (0 < iVar4) {
    iVar3 = resultImage->m_width;
    bVar8 = false;
    CVar10 = SNORM_INT8;
    local_3b8 = (TextureFormat)log;
    do {
      if (0 < iVar3) {
        CVar9 = R;
        do {
          local_2d8.m_name._M_dataplus._M_p._0_4_ =
               *(undefined4 *)
                ((long)(resultImage->m_pixels).m_ptr + (long)(int)(iVar3 * CVar10 + CVar9) * 4);
          local_1b0._4_4_ = CVar10;
          local_1b0._0_4_ = CVar9;
          iVar4 = (**verifier->_vptr_Verifier)(verifier,&local_2d8,local_1b0);
          if ((char)iVar4 == '\0') {
            *(undefined4 *)
             ((long)local_410.m_pixels.m_ptr + (long)(int)(local_410.m_width * CVar10 + CVar9) * 4)
                 = 0xff0000ff;
            bVar8 = true;
          }
          CVar9 = CVar9 + A;
          iVar3 = resultImage->m_width;
        } while ((int)CVar9 < iVar3);
        iVar4 = resultImage->m_height;
      }
      TVar1 = local_3b8;
      CVar10 = CVar10 + SNORM_INT16;
    } while ((int)CVar10 < iVar4);
    log = (TestLog *)local_3b8;
    if (bVar8) {
      if (!logOnSuccess) {
        (*verifier->_vptr_Verifier[1])(verifier,local_3b8);
      }
      TVar2 = local_3b8;
      local_3b8.order = TVar1.order;
      local_3b8.type = TVar1.type;
      local_1b0._0_4_ = local_3b8.order;
      local_1b0._4_4_ = local_3b8.type;
      local_3b8 = TVar2;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 8),"Image verification failed.",0x1a);
      pTVar5 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"Verification","");
      local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"Image Verification","");
      tcu::LogImageSet::LogImageSet(&local_318,&local_430,&local_450);
      tcu::TestLog::startImageSet
                (pTVar5,local_318.m_name._M_dataplus._M_p,local_318.m_description._M_dataplus._M_p);
      local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"Result","");
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"Result image","");
      local_240.m_name._M_dataplus._M_p = (char *)0x300000008;
      pvVar7 = (void *)(resultImage->m_pixels).m_cap;
      if (pvVar7 != (void *)0x0) {
        pvVar7 = (resultImage->m_pixels).m_ptr;
      }
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                ((ConstPixelBufferAccess *)local_380,(TextureFormat *)&local_240,
                 resultImage->m_width,resultImage->m_height,1,pvVar7);
      pCVar6 = (ConstPixelBufferAccess *)local_380;
      tcu::LogImage::LogImage
                (&local_2d8,&local_3d8,&local_3f8,pCVar6,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write(&local_2d8,(int)pTVar5,__buf,(size_t)pCVar6);
      local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"ErrorMask","");
      local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"Error Mask","");
      local_3b0.order = RGBA;
      local_3b0.type = UNORM_INT8;
      if ((void *)local_410.m_pixels.m_cap != (void *)0x0) {
        local_410.m_pixels.m_cap = (size_t)local_410.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_3a8,&local_3b0,local_410.m_width,local_410.m_height,1,
                 (void *)local_410.m_pixels.m_cap);
      pCVar6 = (ConstPixelBufferAccess *)local_3a8;
      tcu::LogImage::LogImage
                (&local_240,&local_338,&local_358,pCVar6,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write(&local_240,(int)pTVar5,__buf_00,(size_t)pCVar6);
      tcu::TestLog::endImageSet(pTVar5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240.m_description._M_dataplus._M_p != &local_240.m_description.field_2) {
        operator_delete(local_240.m_description._M_dataplus._M_p,
                        local_240.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240.m_name._M_dataplus._M_p != &local_240.m_name.field_2) {
        operator_delete(local_240.m_name._M_dataplus._M_p,
                        local_240.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358._M_dataplus._M_p != &local_358.field_2) {
        operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != &local_338.field_2) {
        operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8.m_description._M_dataplus._M_p != &local_2d8.m_description.field_2) {
        operator_delete(local_2d8.m_description._M_dataplus._M_p,
                        local_2d8.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8.m_name._M_dataplus._M_p != &local_2d8.m_name.field_2) {
        operator_delete(local_2d8.m_name._M_dataplus._M_p,
                        local_2d8.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
        operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
        operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318.m_description._M_dataplus._M_p != &local_318.m_description.field_2) {
        operator_delete(local_318.m_description._M_dataplus._M_p,
                        local_318.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318.m_name._M_dataplus._M_p != &local_318.m_name.field_2) {
        operator_delete(local_318.m_name._M_dataplus._M_p,
                        local_318.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != &local_450.field_2) {
        operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_430._M_dataplus._M_p != &local_430.field_2) {
        operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
      std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
      bVar8 = false;
      goto LAB_004065f0;
    }
  }
  bVar8 = true;
  if (logOnSuccess) {
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 8),"Image verification passed.",0x1a);
    pTVar5 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    local_380._0_8_ = (long)local_380 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"Verification","");
    local_3a8._0_8_ = (long)local_3a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"Image Verification","");
    tcu::LogImageSet::LogImageSet((LogImageSet *)&local_240,(string *)local_380,(string *)local_3a8)
    ;
    tcu::TestLog::startImageSet
              (pTVar5,local_240.m_name._M_dataplus._M_p,local_240.m_description._M_dataplus._M_p);
    local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"Result","");
    local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"Result image","");
    local_3d8._M_dataplus._M_p = (pointer)0x300000008;
    pvVar7 = (void *)(resultImage->m_pixels).m_cap;
    if (pvVar7 != (void *)0x0) {
      pvVar7 = (resultImage->m_pixels).m_ptr;
    }
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)&local_318,(TextureFormat *)&local_3d8,resultImage->m_width
               ,resultImage->m_height,1,pvVar7);
    access = &local_318;
    tcu::LogImage::LogImage
              (&local_2d8,&local_430,&local_450,(ConstPixelBufferAccess *)access,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_2d8,(int)pTVar5,__buf_01,(size_t)access);
    tcu::TestLog::endImageSet(pTVar5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8.m_description._M_dataplus._M_p != &local_2d8.m_description.field_2) {
      operator_delete(local_2d8.m_description._M_dataplus._M_p,
                      local_2d8.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8.m_name._M_dataplus._M_p != &local_2d8.m_name.field_2) {
      operator_delete(local_2d8.m_name._M_dataplus._M_p,
                      local_2d8.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p != &local_430.field_2) {
      operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.m_description._M_dataplus._M_p != &local_240.m_description.field_2) {
      operator_delete(local_240.m_description._M_dataplus._M_p,
                      local_240.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.m_name._M_dataplus._M_p != &local_240.m_name.field_2) {
      operator_delete(local_240.m_name._M_dataplus._M_p,
                      local_240.m_name.field_2._M_allocated_capacity + 1);
    }
    if (local_3a8._0_8_ != (long)local_3a8 + 0x10) {
      operator_delete((void *)local_3a8._0_8_,local_3a8._16_8_ + 1);
    }
    if (local_380._0_8_ != (long)local_380 + 0x10) {
      operator_delete((void *)local_380._0_8_,local_380._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  }
LAB_004065f0:
  tcu::Surface::~Surface(&local_410);
  return bVar8;
}

Assistant:

static bool verifyImageWithVerifier (const tcu::Surface& resultImage, tcu::TestLog& log, const Verifier& verifier, bool logOnSuccess = true)
{
	tcu::Surface	errorMask	(resultImage.getWidth(), resultImage.getHeight());
	bool			error		= false;

	tcu::clear(errorMask.getAccess(), tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f));

	if (logOnSuccess)
	{
		log << tcu::TestLog::Message << "Verifying image." << tcu::TestLog::EndMessage;
		verifier.logInfo(log);
	}

	for (int y = 0; y < resultImage.getHeight(); ++y)
	for (int x = 0; x < resultImage.getWidth(); ++x)
	{
		const tcu::RGBA color		= resultImage.getPixel(x, y);

		// verify color value is valid for this pixel position
		if (!verifier.verify(color, tcu::IVec2(x,y)))
		{
			error = true;
			errorMask.setPixel(x, y, tcu::RGBA::red());
		}
	}

	if (error)
	{
		// describe the verification logic if we haven't already
		if (!logOnSuccess)
			verifier.logInfo(log);

		log	<< tcu::TestLog::Message << "Image verification failed." << tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("Verification", "Image Verification")
			<< tcu::TestLog::Image("Result", "Result image", resultImage.getAccess())
			<< tcu::TestLog::Image("ErrorMask", "Error Mask", errorMask.getAccess())
			<< tcu::TestLog::EndImageSet;
	}
	else if (logOnSuccess)
	{
		log << tcu::TestLog::Message << "Image verification passed." << tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("Verification", "Image Verification")
			<< tcu::TestLog::Image("Result", "Result image", resultImage.getAccess())
			<< tcu::TestLog::EndImageSet;
	}

	return !error;
}